

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O3

int __thiscall
yactfr::internal::PseudoVarType::clone
          (PseudoVarType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  optional<yactfr::internal::PseudoDataLoc> pseudoSelLoc;
  TextLocation loc;
  PseudoVarType *this_00;
  void *__child_stack_00;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var1;
  char cVar2;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var3;
  _Vector_impl_data in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffff99;
  pointer in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac [12];
  
  _clonePseudoOpts((PseudoNamedDts *)&stack0xffffffffffffff80,(PseudoVarType *)__fn);
  if (*(__fn **)(__fn + 0x30) == (__fn *)0x0) {
    _Var1._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)&stack0xffffffffffffff98,*(__fn **)(__fn + 0x30),__child_stack_00,
                   __flags,__arg);
    _Var1._M_head_impl._1_7_ = in_stack_ffffffffffffff99;
    _Var1._M_head_impl._0_1_ = in_stack_ffffffffffffff98;
    in_stack_ffffffffffffff99 = 0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &stack0xffffffffffffff98);
  }
  _Var3._M_head_impl = _Var1._M_head_impl;
  this_00 = (PseudoVarType *)operator_new(0xc0);
  cVar2 = __fn[0x50] == (__fn)0x1;
  if ((bool)cVar2) {
    in_stack_ffffffffffffffa8 = *(undefined4 *)(__fn + 0x60);
    in_stack_ffffffffffffffa0 = *(pointer *)(__fn + 0x58);
    _Var1._M_head_impl = _Var3._M_head_impl;
    std::
    vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&stack0xffffffffffffffb0,
             (vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(__fn + 0x68));
  }
  pseudoSelLoc.super_type.m_storage.dummy_._16_8_ = 0;
  pseudoSelLoc.super_type._0_24_ = *(undefined1 (*) [24])(__fn + 8);
  pseudoSelLoc.super_type.m_storage.dummy_._24_8_ = _Var1._M_head_impl;
  pseudoSelLoc.super_type.m_storage.dummy_._32_8_ = in_stack_ffffffffffffff80._M_start;
  pseudoSelLoc.super_type.m_storage.dummy_._40_8_ = in_stack_ffffffffffffff80._M_finish;
  pseudoSelLoc.super_type.m_storage.dummy_._48_8_ = in_stack_ffffffffffffff80._M_end_of_storage;
  pseudoSelLoc.super_type.m_storage.dummy_.data[0x38] = cVar2;
  pseudoSelLoc.super_type.m_storage.dummy_._57_7_ = in_stack_ffffffffffffff99;
  loc._lineNumber._0_4_ = in_stack_ffffffffffffffa8;
  loc._offset = (Index)in_stack_ffffffffffffffa0;
  loc._12_12_ = in_stack_ffffffffffffffac;
  PseudoVarType(this_00,pseudoSelLoc,(PseudoNamedDts *)&stack0xffffffffffffff98,
                (Up)&stack0xffffffffffffff80,loc);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &stack0xffffffffffffff78);
  if (cVar2 == '\x01') {
    std::
    vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xffffffffffffffb0);
  }
  (this->super_PseudoDt)._vptr_PseudoDt = (_func_int **)this_00;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &stack0xffffffffffffff70);
  std::
  vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
  ::~vector((vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
             *)&stack0xffffffffffffff80);
  return (int)this;
}

Assistant:

PseudoDt::Up PseudoVarType::clone() const
{
   return std::make_unique<PseudoVarType>(_pseudoSelLoc, this->_clonePseudoOpts(),
                                          tryCloneAttrs(this->attrs()), this->loc());
}